

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.h
# Opt level: O0

size_t snmalloc::bits::ctz(size_t x)

{
  int iVar1;
  size_t x_local;
  
  iVar1 = 0;
  for (; (x & 1) == 0; x = x >> 1 | 0x8000000000000000) {
    iVar1 = iVar1 + 1;
  }
  return (long)iVar1;
}

Assistant:

inline size_t ctz(size_t x)
    {
      SNMALLOC_ASSERT(x != 0); // Calling with 0 is UB on some implementations

#if defined(_MSC_VER) && !defined(__clang__)
#  if defined(_M_ARM64) || defined(_M_ARM64EC)
      unsigned long n = 0;
      _BitScanForward64(&n, static_cast<unsigned __int64>(x));
      return static_cast<size_t>(n);
#  elif defined(_WIN64)
      return _tzcnt_u64(static_cast<unsigned __int64>(x));
#  else
      return _tzcnt_u32(static_cast<unsigned int>(x));
#  endif
#else
      if constexpr (stl::is_same_v<unsigned long, size_t>)
      {
        return static_cast<size_t>(__builtin_ctzl(x));
      }
      else if constexpr (stl::is_same_v<unsigned long long, size_t>)
      {
        return static_cast<size_t>(__builtin_ctzll(x));
      }
      else if constexpr (stl::is_same_v<unsigned int, size_t>)
      {
        return static_cast<size_t>(__builtin_ctz(x));
      }
#endif
    }